

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int test_candidate_kf(FIRSTPASS_INFO *firstpass_info,int this_stats_index,int frame_count_so_far,
                     aom_rc_mode rc_mode,int scenecut_mode,int num_mbs)

{
  double dVar1;
  int iVar2;
  FIRSTPASS_STATS *pFVar3;
  FIRSTPASS_STATS *this_frame;
  FIRSTPASS_STATS *next_frame;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  FIRSTPASS_INFO *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar4;
  double dVar5;
  double dVar6;
  double next_iiratio;
  FIRSTPASS_STATS *local_next_frame;
  double decay_accumulator;
  double old_boost_score;
  double boost_score;
  int i;
  int stats_after_this_stats;
  int count_for_tolerable_prediction;
  int frames_to_test_after_candidate_key;
  double second_ref_usage_thresh;
  double modified_pcnt_inter;
  double pcnt_intra;
  int is_viable_kf;
  FIRSTPASS_STATS *next_stats;
  FIRSTPASS_STATS *this_stats;
  FIRSTPASS_STATS *last_stats;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  int local_9c;
  double local_98;
  double local_88;
  double local_78;
  int local_70;
  int local_68;
  int local_64;
  int local_44;
  
  pFVar3 = av1_firstpass_info_peek(in_RDI,in_ESI + -1);
  this_frame = av1_firstpass_info_peek(in_RDI,in_ESI);
  next_frame = av1_firstpass_info_peek(in_RDI,in_ESI + 1);
  if (((pFVar3 == (FIRSTPASS_STATS *)0x0) || (this_frame == (FIRSTPASS_STATS *)0x0)) ||
     (next_frame == (FIRSTPASS_STATS *)0x0)) {
    return 0;
  }
  dVar4 = 1.0 - this_frame->pcnt_inter;
  dVar6 = this_frame->pcnt_inter;
  dVar1 = this_frame->pcnt_neutral;
  dVar5 = get_second_ref_usage_thresh(in_EDX);
  local_64 = 0x10;
  local_68 = 3;
  local_9c = av1_firstpass_info_future_count(in_RDI,in_ESI);
  local_9c = local_9c + -1;
  if (in_R8D == 1) {
    if (local_9c < 3) {
      return 0;
    }
    local_64 = 3;
    local_68 = 1;
  }
  if (local_64 < local_9c) {
    local_9c = local_64;
  }
  if ((in_ECX == 3) && (in_EDX < 3)) {
    return 0;
  }
  if (dVar5 <= this_frame->pcnt_second_ref) {
    return 0;
  }
  if (dVar5 <= next_frame->pcnt_second_ref) {
    return 0;
  }
  if ((0.05 < this_frame->pcnt_inter || this_frame->pcnt_inter == 0.05) &&
     (iVar2 = slide_transition(this_frame,pFVar3,next_frame), iVar2 == 0)) {
    if (dVar4 <= 0.25) {
      return 0;
    }
    if (dVar4 <= (dVar6 - dVar1) * 2.0) {
      return 0;
    }
    if (0.0 < this_frame->coded_error || this_frame->coded_error == 0.0) {
      local_b0 = this_frame->coded_error + 1e-06;
    }
    else {
      local_b0 = this_frame->coded_error - 1e-06;
    }
    if (1.9 <= this_frame->intra_error / local_b0) {
      return 0;
    }
    if (0.0 < this_frame->coded_error || this_frame->coded_error == 0.0) {
      local_c0 = this_frame->coded_error + 1e-06;
    }
    else {
      local_c0 = this_frame->coded_error - 1e-06;
    }
    if (ABS(pFVar3->coded_error - this_frame->coded_error) / local_c0 <= 0.4) {
      if (0.0 < this_frame->intra_error || this_frame->intra_error == 0.0) {
        local_d0 = this_frame->intra_error + 1e-06;
      }
      else {
        local_d0 = this_frame->intra_error - 1e-06;
      }
      if (ABS(pFVar3->intra_error - this_frame->intra_error) / local_d0 <= 0.4) {
        if (0.0 < next_frame->coded_error || next_frame->coded_error == 0.0) {
          local_e0 = next_frame->coded_error + 1e-06;
        }
        else {
          local_e0 = next_frame->coded_error - 1e-06;
        }
        if (next_frame->intra_error / local_e0 <= 3.5) {
          return 0;
        }
      }
    }
  }
  local_78 = 0.0;
  local_88 = 1.0;
  for (local_70 = 1; dVar6 = local_78, local_70 <= local_9c; local_70 = local_70 + 1) {
    pFVar3 = av1_firstpass_info_peek(in_RDI,in_ESI + local_70);
    if (0.0 < pFVar3->coded_error || pFVar3->coded_error == 0.0) {
      local_f0 = pFVar3->coded_error + 1e-06;
    }
    else {
      local_f0 = pFVar3->coded_error - 1e-06;
    }
    local_98 = (pFVar3->intra_error * 12.5) / local_f0;
    if (128.0 < local_98) {
      local_98 = 128.0;
    }
    if (pFVar3->pcnt_inter <= 0.85) {
      dVar6 = (pFVar3->pcnt_inter + 0.85) / 2.0;
    }
    else {
      dVar6 = pFVar3->pcnt_inter;
    }
    local_88 = dVar6 * local_88;
    dVar6 = local_88 * local_98 + local_78;
    if ((((pFVar3->pcnt_inter <= 0.05 && pFVar3->pcnt_inter != 0.05) || (local_98 < 1.5)) ||
        ((pFVar3->pcnt_inter - pFVar3->pcnt_neutral < 0.2 && (local_98 < 3.0)))) ||
       ((dVar6 - local_78 < 3.0 || (pFVar3->intra_error < 200.0 / (double)in_R9D)))) break;
    local_78 = dVar6;
  }
  local_78 = dVar6;
  if ((local_78 <= 30.0) || (local_70 <= local_68)) {
    local_44 = 0;
  }
  else {
    local_44 = 1;
  }
  return local_44;
}

Assistant:

static int test_candidate_kf(const FIRSTPASS_INFO *firstpass_info,
                             int this_stats_index, int frame_count_so_far,
                             enum aom_rc_mode rc_mode, int scenecut_mode,
                             int num_mbs) {
  const FIRSTPASS_STATS *last_stats =
      av1_firstpass_info_peek(firstpass_info, this_stats_index - 1);
  const FIRSTPASS_STATS *this_stats =
      av1_firstpass_info_peek(firstpass_info, this_stats_index);
  const FIRSTPASS_STATS *next_stats =
      av1_firstpass_info_peek(firstpass_info, this_stats_index + 1);
  if (last_stats == NULL || this_stats == NULL || next_stats == NULL) {
    return 0;
  }

  int is_viable_kf = 0;
  double pcnt_intra = 1.0 - this_stats->pcnt_inter;
  double modified_pcnt_inter =
      this_stats->pcnt_inter - this_stats->pcnt_neutral;
  const double second_ref_usage_thresh =
      get_second_ref_usage_thresh(frame_count_so_far);
  int frames_to_test_after_candidate_key = SCENE_CUT_KEY_TEST_INTERVAL;
  int count_for_tolerable_prediction = 3;

  // We do "-1" because the candidate key is not counted.
  int stats_after_this_stats =
      av1_firstpass_info_future_count(firstpass_info, this_stats_index) - 1;

  if (scenecut_mode == ENABLE_SCENECUT_MODE_1) {
    if (stats_after_this_stats < 3) {
      return 0;
    } else {
      frames_to_test_after_candidate_key = 3;
      count_for_tolerable_prediction = 1;
    }
  }
  // Make sure we have enough stats after the candidate key.
  frames_to_test_after_candidate_key =
      AOMMIN(frames_to_test_after_candidate_key, stats_after_this_stats);

  // Does the frame satisfy the primary criteria of a key frame?
  // See above for an explanation of the test criteria.
  // If so, then examine how well it predicts subsequent frames.
  if (IMPLIES(rc_mode == AOM_Q, frame_count_so_far >= 3) &&
      (this_stats->pcnt_second_ref < second_ref_usage_thresh) &&
      (next_stats->pcnt_second_ref < second_ref_usage_thresh) &&
      ((this_stats->pcnt_inter < VERY_LOW_INTER_THRESH) ||
       slide_transition(this_stats, last_stats, next_stats) ||
       ((pcnt_intra > MIN_INTRA_LEVEL) &&
        (pcnt_intra > (INTRA_VS_INTER_THRESH * modified_pcnt_inter)) &&
        ((this_stats->intra_error /
          DOUBLE_DIVIDE_CHECK(this_stats->coded_error)) <
         KF_II_ERR_THRESHOLD) &&
        ((fabs(last_stats->coded_error - this_stats->coded_error) /
              DOUBLE_DIVIDE_CHECK(this_stats->coded_error) >
          ERR_CHANGE_THRESHOLD) ||
         (fabs(last_stats->intra_error - this_stats->intra_error) /
              DOUBLE_DIVIDE_CHECK(this_stats->intra_error) >
          ERR_CHANGE_THRESHOLD) ||
         ((next_stats->intra_error /
           DOUBLE_DIVIDE_CHECK(next_stats->coded_error)) >
          II_IMPROVEMENT_THRESHOLD))))) {
    int i;
    double boost_score = 0.0;
    double old_boost_score = 0.0;
    double decay_accumulator = 1.0;

    // Examine how well the key frame predicts subsequent frames.
    for (i = 1; i <= frames_to_test_after_candidate_key; ++i) {
      // Get the next frame details
      const FIRSTPASS_STATS *local_next_frame =
          av1_firstpass_info_peek(firstpass_info, this_stats_index + i);
      double next_iiratio =
          (BOOST_FACTOR * local_next_frame->intra_error /
           DOUBLE_DIVIDE_CHECK(local_next_frame->coded_error));

      if (next_iiratio > KF_II_MAX) next_iiratio = KF_II_MAX;

      // Cumulative effect of decay in prediction quality.
      if (local_next_frame->pcnt_inter > 0.85)
        decay_accumulator *= local_next_frame->pcnt_inter;
      else
        decay_accumulator *= (0.85 + local_next_frame->pcnt_inter) / 2.0;

      // Keep a running total.
      boost_score += (decay_accumulator * next_iiratio);

      // Test various breakout clauses.
      // TODO(any): Test of intra error should be normalized to an MB.
      if ((local_next_frame->pcnt_inter < 0.05) || (next_iiratio < 1.5) ||
          (((local_next_frame->pcnt_inter - local_next_frame->pcnt_neutral) <
            0.20) &&
           (next_iiratio < 3.0)) ||
          ((boost_score - old_boost_score) < 3.0) ||
          (local_next_frame->intra_error < (200.0 / (double)num_mbs))) {
        break;
      }

      old_boost_score = boost_score;
    }

    // If there is tolerable prediction for at least the next 3 frames then
    // break out else discard this potential key frame and move on
    if (boost_score > 30.0 && (i > count_for_tolerable_prediction)) {
      is_viable_kf = 1;
    } else {
      is_viable_kf = 0;
    }
  }
  return is_viable_kf;
}